

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O3

UnlocalizedNumberFormatter * __thiscall
icu_63::number::UnlocalizedNumberFormatter::operator=(UnlocalizedNumberFormatter *this,UNF *src)

{
  SymbolsPointerType SVar1;
  PluralRules *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  UNumberSignDisplay UVar6;
  long lVar7;
  Precision *pPVar8;
  Precision *pPVar9;
  byte bVar10;
  
  bVar10 = 0;
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.notation
  .fUnion.scientific.fExponentSignDisplay =
       (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
       notation.fUnion.scientific.fExponentSignDisplay;
  *(undefined8 *)
   &(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
    notation = *(undefined8 *)
                &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                 fMacros.notation;
  MeasureUnit::operator=
            (&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.unit,
             &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.unit);
  MeasureUnit::operator=
            (&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.perUnit,
             &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.perUnit);
  pPVar8 = &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros
            .precision;
  pPVar9 = &(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
            fMacros.precision;
  for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar5 = *(undefined4 *)&pPVar8->field_0x4;
    pPVar9->fType = pPVar8->fType;
    *(undefined4 *)&pPVar9->field_0x4 = uVar5;
    pPVar8 = (Precision *)((long)pPVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    pPVar9 = (Precision *)((long)pPVar9 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
  integerWidth.fHasError =
       (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
       integerWidth.fHasError;
  *(undefined4 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros
           .integerWidth.fUnion + 4) =
       *(undefined4 *)
        ((long)&(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                fMacros.integerWidth.fUnion + 4);
  if (this != src) {
    impl::SymbolsWrapper::doCleanup
              (&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                fMacros.symbols);
    SVar1 = (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros
            .symbols.fType;
    (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
    symbols.fType = SVar1;
    if (SVar1 - SYMPTR_DFS < 2) {
      (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
      symbols.fPtr = (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
                     ).fMacros.symbols.fPtr;
      (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
      symbols.fPtr.dfs = (DecimalFormatSymbols *)0x0;
    }
  }
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.decimal
       = (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
         decimal;
  UVar6 = (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
          sign;
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
  unitWidth = (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.unitWidth;
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.sign =
       UVar6;
  Scale::operator=(&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
                    ).fMacros.scale,
                   &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>)
                    .fMacros.scale);
  pPVar2 = (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
           rules;
  uVar3 = *(undefined8 *)
           ((long)&(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                   fMacros.rules + 4);
  uVar4 = *(undefined8 *)
           ((long)&(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                   fMacros.currencySymbols + 4);
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
  affixProvider =
       (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
       affixProvider;
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.rules =
       pPVar2;
  *(undefined8 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros
           .rules + 4) = uVar3;
  *(undefined8 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros
           .currencySymbols + 4) = uVar4;
  Locale::operator=(&(this->
                     super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                     fMacros.locale,
                    &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
                     ).fMacros.locale);
  return this;
}

Assistant:

UnlocalizedNumberFormatter& UnlocalizedNumberFormatter::operator=(UNF&& src) U_NOEXCEPT {
    NFS<UNF>::operator=(static_cast<NFS<UNF>&&>(src));
    // No additional fields to assign
    return *this;
}